

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

Reg ra_restore(ASMState *as,IRRef ref)

{
  byte bVar1;
  int32_t ofs_00;
  IRIns *ir_00;
  Reg r;
  int32_t ofs;
  IRIns *ir;
  IRRef ref_local;
  ASMState *as_local;
  
  if (ref < 0x8001) {
    as_local._4_4_ = ra_rematk(as,ref);
  }
  else {
    ir_00 = as->ir + ref;
    ofs_00 = ra_spill(as,ir_00);
    bVar1 = (ir_00->field_1).r;
    as_local._4_4_ = (Reg)bVar1;
    (ir_00->field_1).r = bVar1 | 0x80;
    as->freeset = 1 << (bVar1 & 0x1f) | as->freeset;
    if ((as->weakset >> (bVar1 & 0x1f) & 1) == 0) {
      as->modset = 1 << (bVar1 & 0x1f) | as->modset;
      emit_loadofs(as,ir_00,as_local._4_4_,4,ofs_00);
    }
  }
  return as_local._4_4_;
}

Assistant:

static Reg ra_restore(ASMState *as, IRRef ref)
{
  if (emit_canremat(ref)) {
    return ra_rematk(as, ref);
  } else {
    IRIns *ir = IR(ref);
    int32_t ofs = ra_spill(as, ir);  /* Force a spill slot. */
    Reg r = ir->r;
    lj_assertA(ra_hasreg(r), "restore of IR %04d has no reg", ref - REF_BIAS);
    ra_sethint(ir->r, r);  /* Keep hint. */
    ra_free(as, r);
    if (!rset_test(as->weakset, r)) {  /* Only restore non-weak references. */
      ra_modified(as, r);
      RA_DBGX((as, "restore   $i $r", ir, r));
      emit_spload(as, ir, r, ofs);
    }
    return r;
  }
}